

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

Matrix<float,_2,_2> __thiscall
vkt::sr::(anonymous_namespace)::MatrixCaseUtils::decrement<float,2,2>
          (MatrixCaseUtils *this,Matrix<float,_2,_2> *mat)

{
  float *pfVar1;
  float extraout_XMM0_Qa [2];
  Vector<float,_2> VVar2;
  Vector<float,_2> in_XMM1_Qa;
  Matrix<float,_2,_2> MVar3;
  undefined4 local_24;
  undefined4 local_20;
  int c;
  int r;
  Matrix<float,_2,_2> *mat_local;
  Matrix<float,_2,_2> *retVal;
  
  tcu::Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  VVar2.m_data = extraout_XMM0_Qa;
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
      pfVar1 = tcu::Matrix<float,_2,_2>::operator()(mat,local_20,local_24);
      in_XMM1_Qa.m_data[0] = -1.0;
      in_XMM1_Qa.m_data[1] = 0.0;
      VVar2.m_data[0] = *pfVar1 + -1.0;
      pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,local_20,local_24);
      VVar2.m_data[1] = 0.0;
      *pfVar1 = VVar2.m_data[0];
    }
  }
  MVar3.m_data.m_data[1].m_data[0] = in_XMM1_Qa.m_data[0];
  MVar3.m_data.m_data[1].m_data[1] = in_XMM1_Qa.m_data[1];
  MVar3.m_data.m_data[0].m_data[0] = VVar2.m_data[0];
  MVar3.m_data.m_data[0].m_data[1] = VVar2.m_data[1];
  return (Matrix<float,_2,_2>)MVar3.m_data.m_data;
}

Assistant:

tcu::Matrix<T, Rows, Cols> decrement (const tcu::Matrix<T, Rows, Cols>& mat)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = mat(r, c) - 1.0f;

	return retVal;
}